

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ParseObjectReset(Parse *pParse)

{
  Lookaside *pLVar1;
  sqlite3 *db;
  u16 uVar2;
  TableLock *p;
  ParseCleanup *pCleanup;
  
  db = pParse->db;
  p = pParse->aTableLock;
  if (p == (TableLock *)0x0) goto LAB_0011e6bd;
  while( true ) {
    sqlite3DbFreeNN(db,p);
LAB_0011e6bd:
    p = (TableLock *)pParse->pCleanup;
    if (p == (TableLock *)0x0) break;
    pParse->pCleanup = *(ParseCleanup **)p;
    (*(code *)p->zLockName)(db,*(undefined8 *)&p->isWriteLock);
  }
  if (pParse->aLabel != (int *)0x0) {
    sqlite3DbFreeNN(db,pParse->aLabel);
  }
  if (pParse->pConstExpr != (ExprList *)0x0) {
    exprListDeleteNN(db,pParse->pConstExpr);
  }
  pLVar1 = &db->lookaside;
  pLVar1->bDisable = pLVar1->bDisable - (uint)pParse->disableLookaside;
  if (pLVar1->bDisable == 0) {
    uVar2 = (db->lookaside).szTrue;
  }
  else {
    uVar2 = 0;
  }
  (db->lookaside).sz = uVar2;
  db->pParse = pParse->pOuterParse;
  pParse->db = (sqlite3 *)0x0;
  pParse->disableLookaside = '\0';
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ParseObjectReset(Parse *pParse){
  sqlite3 *db = pParse->db;
  assert( db!=0 );
  assert( db->pParse==pParse );
  assert( pParse->nested==0 );
#ifndef SQLITE_OMIT_SHARED_CACHE
  sqlite3DbFree(db, pParse->aTableLock);
#endif
  while( pParse->pCleanup ){
    ParseCleanup *pCleanup = pParse->pCleanup;
    pParse->pCleanup = pCleanup->pNext;
    pCleanup->xCleanup(db, pCleanup->pPtr);
    sqlite3DbFreeNN(db, pCleanup);
  }
  sqlite3DbFree(db, pParse->aLabel);
  if( pParse->pConstExpr ){
    sqlite3ExprListDelete(db, pParse->pConstExpr);
  }
  assert( db->lookaside.bDisable >= pParse->disableLookaside );
  db->lookaside.bDisable -= pParse->disableLookaside;
  db->lookaside.sz = db->lookaside.bDisable ? 0 : db->lookaside.szTrue;
  assert( pParse->db->pParse==pParse );
  db->pParse = pParse->pOuterParse;
  pParse->db = 0;
  pParse->disableLookaside = 0;
}